

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O1

void utest_gui_component_parse_color_3(int *utest_result,size_t utest_index)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  pointer pGVar6;
  char *pcVar7;
  long lVar8;
  string error;
  string line;
  string uniform_line;
  GUIComponent component;
  allocator<char> local_159;
  undefined1 local_158 [24];
  long lStack_140;
  int *local_130;
  string local_128;
  string local_108;
  string local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  GUIComponent local_a8;
  long *local_60 [2];
  long local_50 [2];
  char *local_40 [2];
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_a8.UniformName._M_string_length = 0;
  local_a8.UniformName.field_2._M_allocated_capacity = 0;
  local_a8.UniformName.field_2._8_8_ = 0;
  local_a8._40_8_ = 0;
  local_a8._48_8_ = 0;
  local_a8.Data[1] = 0.0;
  local_a8.Data[2] = 0.0;
  local_a8.Data[3] = 0.0;
  local_a8._68_4_ = 0;
  local_a8.Type = EGUIComponentTypeSlider1;
  local_a8.UniformType = EGUIUniformTypeFloat;
  local_a8.UniformName._M_dataplus._M_p = (pointer)0x0;
  local_130 = utest_result;
  std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x15f89a);
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)local_e8._M_string_length,0x15f7a1);
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                            &local_a8,&local_128);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xed);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xed);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      bVar2 = GUIComponentParse(0,&local_108,&local_e8,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                &local_a8,&local_128);
      pcVar7 = "false";
      if (bVar2) {
        pcVar7 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    }
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    GUIComponentParse(0,&local_108,&local_e8,
                      (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,&local_a8,
                      &local_128);
    printf("    Actual : %s\n");
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    *local_130 = 1;
  }
  if (local_a8.UniformType != EGUIUniformTypeVec3) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xee);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xee);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar7 = "false";
      if (local_a8.UniformType == EGUIUniformTypeVec3) {
        pcVar7 = "true";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar7);
    }
    printf("    Actual : %s\n");
    *local_130 = 1;
  }
  if (local_128._M_string_length != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xef);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xef);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar7 = "false";
      if (local_128._M_string_length == 0) {
        pcVar7 = "true";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar7);
    }
    printf("    Actual : %s\n");
    *local_130 = 1;
  }
  std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)local_108._M_string_length,0x15f8a1);
  local_40[0] = "float";
  local_40[1] = "vec2";
  lVar8 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,*(char **)((long)local_40 + lVar8),&local_159);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x15f5f8);
    local_c8 = &local_b8;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_b8 = *plVar5;
      lStack_b0 = plVar4[3];
    }
    else {
      local_b8 = *plVar5;
      local_c8 = (long *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    pGVar6 = (pointer)(plVar4 + 2);
    if ((pointer)*plVar4 == pGVar6) {
      local_158._16_8_ = *(undefined8 *)pGVar6;
      lStack_140 = plVar4[3];
      local_158._0_8_ = (pointer)(local_158 + 0x10);
    }
    else {
      local_158._16_8_ = *(undefined8 *)pGVar6;
      local_158._0_8_ = (pointer)*plVar4;
    }
    local_158._8_8_ = plVar4[1];
    *plVar4 = (long)pGVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)local_158);
    if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,
                      (ulong)((long)(EGUIComponentType *)local_158._16_8_ + 1));
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    bVar2 = GUIComponentParse(5,&local_108,&local_e8,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                              &local_a8,&local_128);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
    if (bVar2) {
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
                ,0xfe);
      }
      printf("%s:%u: Failure\n",
             "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
             ,0xfe);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
      }
      puts("  Expected : true");
      pFVar1 = utest_state.output;
      if (utest_state.output != (FILE *)0x0) {
        local_158._0_8_ = (pointer)0x0;
        local_158._8_8_ = (pointer)0x0;
        local_158._16_8_ = (pointer)0x0;
        bVar2 = GUIComponentParse(5,&local_108,&local_e8,
                                  (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                  &local_a8,&local_128);
        pcVar7 = "false";
        if (!bVar2) {
          pcVar7 = "true";
        }
        fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
        std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                  ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
      }
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      bVar2 = GUIComponentParse(5,&local_108,&local_e8,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158,
                                &local_a8,&local_128);
      pcVar7 = "false";
      if (!bVar2) {
        pcVar7 = "true";
      }
      printf("    Actual : %s\n",pcVar7);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)local_158);
      *local_130 = 1;
    }
    iVar3 = strcmp(local_128._M_dataplus._M_p,
                   "GUI component count does not match uniform component count at line 5");
    if (iVar3 != 0) {
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
                ,0xff);
      }
      printf("%s:%u: Failure\n",
             "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
             ,0xff);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
      }
      puts("  Expected : true");
      pFVar1 = utest_state.output;
      if (utest_state.output != (FILE *)0x0) {
        iVar3 = strcmp(local_128._M_dataplus._M_p,
                       "GUI component count does not match uniform component count at line 5");
        pcVar7 = "true";
        if (iVar3 != 0) {
          pcVar7 = "false";
        }
        fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar7);
      }
      iVar3 = strcmp(local_128._M_dataplus._M_p,
                     "GUI component count does not match uniform component count at line 5");
      pcVar7 = "true";
      if (iVar3 != 0) {
        pcVar7 = "false";
      }
      printf("    Actual : %s\n",pcVar7);
      *local_130 = 1;
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.UniformName._M_dataplus._M_p != &local_a8.UniformName.field_2) {
    operator_delete(local_a8.UniformName._M_dataplus._M_p,
                    local_a8.UniformName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

UTEST(gui, component_parse_color_3) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "color3";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));
    T(component.UniformType == EGUIUniformTypeVec3);
    T(error.empty());

#if 0
    line = "color3()";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));

    line = "color3(5.0)";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(2, line, uniform_line, {}, component, error));
#endif

    line = "color3(0.1, -1, 2.5)";
    for (const auto& datatype : {"float", "vec2"}) {
        uniform_line = "uniform " + std::string(datatype) + " v0;";
        T(!GUIComponentParse(5, line, uniform_line, {}, component, error));
        TSTR(error.c_str(), "GUI component count does not match uniform component count at line 5");
    }
}